

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O2

void test_bcon_new(void)

{
  int iVar1;
  int __fd;
  long lVar2;
  void *__buf;
  void *__buf_00;
  void *__s1;
  void *__s2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  uint uVar9;
  bson_t expected;
  undefined1 local_180 [4];
  uint local_17c;
  
  bson_init(local_180);
  bson_append_utf8(local_180,"hello",0xffffffffffffffff,"world",0xffffffff);
  lVar2 = bcon_new(0,"hello","world",0);
  __buf = (void *)bson_get_data(lVar2);
  __buf_00 = (void *)bson_get_data(local_180);
  if (local_17c == *(uint *)(lVar2 + 4)) {
    __s1 = (void *)bson_get_data(local_180);
    __s2 = (void *)bson_get_data(lVar2);
    iVar1 = bcmp(__s1,__s2,(ulong)local_17c);
    if (iVar1 == 0) {
      bson_destroy(lVar2);
      bson_destroy(local_180);
      return;
    }
  }
  uVar3 = bson_as_canonical_extended_json(lVar2,0);
  uVar4 = bson_as_canonical_extended_json(local_180,0);
  uVar6 = *(uint *)(lVar2 + 4);
  uVar9 = 0;
  uVar7 = local_17c;
  if (uVar6 < local_17c) {
    uVar9 = 0;
    uVar7 = uVar6;
  }
  for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
    if (*(char *)((long)__buf + (ulong)uVar9) != *(char *)((long)__buf_00 + (ulong)uVar9))
    goto LAB_0013338a;
  }
  if (uVar6 < local_17c) {
    uVar6 = local_17c;
  }
  uVar9 = uVar6 - 1;
LAB_0013338a:
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)uVar9,uVar3,uVar4);
  iVar1 = open("failure.bad.bson",0x42,0x1a0);
  __fd = open("failure.expected.bson",0x42,0x1a0);
  if (iVar1 == -1) {
    pcVar8 = "fd1 != -1";
  }
  else if (__fd == -1) {
    pcVar8 = "fd2 != -1";
  }
  else {
    uVar6 = *(uint *)(lVar2 + 4);
    uVar5 = write(iVar1,__buf,(ulong)uVar6);
    if (uVar5 == uVar6) {
      uVar5 = write(__fd,__buf_00,(ulong)local_17c);
      if (uVar5 == local_17c) {
        close(iVar1);
        close(__fd);
        pcVar8 = "0";
      }
      else {
        pcVar8 = "(&expected)->len == bson_write (fd2, expected_data, (&expected)->len)";
      }
    }
    else {
      pcVar8 = "(bcon)->len == bson_write (fd1, bson_data, (bcon)->len)";
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-basic.c"
          ,0x245,"test_bcon_new",pcVar8);
  abort();
}

Assistant:

static void
test_bcon_new (void)
{
   bson_t expected;
   bson_t *bcon;

   bson_init (&expected);

   bson_append_utf8 (&expected, "hello", -1, "world", -1);
   bcon = BCON_NEW ("hello", "world");

   bson_eq_bson (bcon, &expected);

   bson_destroy (bcon);
   bson_destroy (&expected);
}